

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O2

void __thiscall NPC::Die(NPC *this,bool show)

{
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *this_00;
  Character *this_01;
  Map *pMVar1;
  bool bVar2;
  _List_iterator<NPC_*> __first;
  __normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_> __first_00;
  _List_iterator<NPC_*> __last;
  list<Character_*,_std::allocator<Character_*>_> *plVar3;
  _List_node_base *p_Var4;
  double dVar5;
  PacketBuilder builder;
  
  if (this->alive == true) {
    this->alive = false;
    this->parent = (NPC *)0x0;
    dVar5 = Timer::GetTime();
    this->dead_since = (double)(int)dVar5;
    this_00 = &this->damagelist;
    p_Var4 = (_List_node_base *)this_00;
    while (p_Var4 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                       *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)this_00) {
      __last._M_node = (_List_node_base *)(*(long *)p_Var4[1]._M_next + 0x378);
      builder._0_8_ = this;
      __first = std::
                __remove_if<std::_List_iterator<NPC*>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                          (*(_List_node_base **)(*(long *)p_Var4[1]._M_next + 0x378),__last,
                           (_Iter_equals_val<NPC_*const>)&builder);
      std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
                ((list<NPC_*,_std::allocator<NPC_*>_> *)__last._M_node,
                 (const_iterator)__first._M_node,
                 (_List_node_base *)(*(long *)p_Var4[1]._M_next + 0x378));
    }
    std::__cxx11::
    list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
    ::clear(this_00);
    this->totaldamage = 0;
    if (show) {
      PacketBuilder::PacketBuilder(&builder,PACKET_NPC,PACKET_SPEC,0x12);
      PacketBuilder::AddShort(&builder,0);
      PacketBuilder::AddChar(&builder,0);
      PacketBuilder::AddShort(&builder,(uint)this->index);
      PacketBuilder::AddShort(&builder,0);
      PacketBuilder::AddShort(&builder,0);
      PacketBuilder::AddChar(&builder,(uint)this->x);
      PacketBuilder::AddChar(&builder,(uint)this->y);
      PacketBuilder::AddInt(&builder,0);
      PacketBuilder::AddThree(&builder,this->hp);
      plVar3 = &this->map->characters;
      p_Var4 = (_List_node_base *)plVar3;
      while (p_Var4 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var4->_M_next)->
                      _M_impl)._M_node.super__List_node_base._M_next,
            p_Var4 != (_List_node_base *)plVar3) {
        this_01 = (Character *)p_Var4[1]._M_next;
        bVar2 = Character::InRange(this_01,this);
        if (bVar2) {
          Character::Send(this_01,&builder);
        }
      }
      PacketBuilder::~PacketBuilder(&builder);
    }
    if (this->temporary == true) {
      pMVar1 = this->map;
      builder._0_8_ = this;
      __first_00 = std::
                   __remove_if<__gnu_cxx::__normal_iterator<NPC**,std::vector<NPC*,std::allocator<NPC*>>>,__gnu_cxx::__ops::_Iter_equals_val<NPC*const>>
                             ((__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                               )(pMVar1->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                              (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                               )(pMVar1->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish,
                              (_Iter_equals_val<NPC_*const>)&builder);
      std::vector<NPC_*,_std::allocator<NPC_*>_>::erase
                (&pMVar1->npcs,(const_iterator)__first_00._M_current,
                 (const_iterator)
                 (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      ~NPC(this);
      operator_delete(this,0x70);
    }
  }
  return;
}

Assistant:

void NPC::Die(bool show)
{
	if (!this->alive)
		return;

	this->alive = false;
	this->parent = 0;
	this->dead_since = int(Timer::GetTime());

	UTIL_FOREACH_CREF(this->damagelist, opponent)
	{
		opponent->attacker->unregister_npc.erase(
			std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), this),
			opponent->attacker->unregister_npc.end()
		);
	}

	this->damagelist.clear();
	this->totaldamage = 0;

	if (show)
	{
		PacketBuilder builder(PACKET_NPC, PACKET_SPEC, 18);
		builder.AddShort(0); // killer pid
		builder.AddChar(0); // killer direction
		builder.AddShort(this->index);
		builder.AddShort(0); // dropped item uid
		builder.AddShort(0); // dropped item id
		builder.AddChar(this->x);
		builder.AddChar(this->y);
		builder.AddInt(0); // dropped item amount
		builder.AddThree(this->hp); // damage

		UTIL_FOREACH(this->map->characters, character)
		{
			if (character->InRange(this))
			{
				character->Send(builder);
			}
		}
	}

	if (this->temporary)
	{
		this->map->npcs.erase(
			std::remove(this->map->npcs.begin(), this->map->npcs.end(), this),
			this->map->npcs.end()
		);

		delete this;
	}
}